

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

int llex(LexState *ls,SemInfo *seminfo)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  ZIO *pZVar4;
  byte *pbVar5;
  SemInfo *pSVar6;
  SemInfo *pSVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  TString *pTVar12;
  ulong uVar13;
  size_t sVar14;
  lconv *plVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  uint local_44 [3];
  SemInfo *local_38;
  
  ls->buff->n = 0;
  while( true ) {
    uVar9 = ls->current;
    if (0x5a < (long)(int)uVar9) break;
    switch(uVar9) {
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      break;
    case 10:
    case 0xd:
      inclinenumber(ls);
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2f:
    case 0x3b:
      goto switchD_0010b3b5_caseD_e;
    case 0x22:
    case 0x27:
      save(ls,uVar9);
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar8 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar8 = (uint)*pbVar5;
      }
      ls->current = uVar8;
      pSVar7 = seminfo;
      pSVar6 = local_38;
      goto joined_r0x0010b618;
    case 0x2d:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 != 0x2d) {
        return 0x2d;
      }
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 == 0x5b) {
        iVar11 = skip_sep(ls);
        ls->buff->n = 0;
        if (iVar11 < 0) goto LAB_0010b48e;
        read_long_string(ls,(SemInfo *)0x0,iVar11);
        ls->buff->n = 0;
      }
      else {
LAB_0010b48e:
        while ((uVar9 = ls->current + 1, 0xe < uVar9 || ((0x4801U >> (uVar9 & 0x1f) & 1) == 0))) {
          pZVar4 = ls->z;
          sVar14 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar14 == 0) {
            uVar9 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar9 = (uint)*pbVar5;
          }
          ls->current = uVar9;
        }
      }
      break;
    case 0x2e:
      save(ls,0x2e);
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      iVar11 = check_next(ls,".");
      if (iVar11 != 0) {
        iVar11 = check_next(ls,".");
        return 0x118 - (uint)(iVar11 == 0);
      }
      if ((""[(long)ls->current + 1] & 2) == 0) {
        return 0x2e;
      }
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      iVar11 = ls->current;
      save(ls,iVar11);
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (iVar11 == 0x30) {
        iVar11 = check_next(ls,"Xx");
        pcVar16 = "Pp";
        if (iVar11 == 0) {
          pcVar16 = "Ee";
        }
      }
      else {
        pcVar16 = "Ee";
      }
      while( true ) {
        iVar11 = check_next(ls,pcVar16);
        if (iVar11 != 0) {
          check_next(ls,"+-");
        }
        iVar11 = ls->current;
        if (((long)iVar11 != 0x2e) && ((""[(long)iVar11 + 1] & 0x10) == 0)) break;
        save(ls,iVar11);
        pZVar4 = ls->z;
        sVar14 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar14 == 0) {
          uVar9 = luaZ_fill(pZVar4);
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar9 = (uint)*pbVar5;
        }
        ls->current = uVar9;
      }
      save(ls,0);
      sVar14 = ls->buff->n;
      if (sVar14 != 0) {
        cVar2 = ls->decpoint;
        pcVar16 = ls->buff->buffer;
        do {
          if (pcVar16[sVar14 - 1] == '.') {
            pcVar16[sVar14 - 1] = cVar2;
          }
          sVar14 = sVar14 - 1;
        } while (sVar14 != 0);
      }
      iVar11 = luaO_str2d(ls->buff->buffer,ls->buff->n - 1,&seminfo->r);
      if (iVar11 != 0) {
        return 0x11f;
      }
      cVar2 = ls->decpoint;
      plVar15 = localeconv();
      cVar3 = *plVar15->decimal_point;
      ls->decpoint = cVar3;
      sVar14 = ls->buff->n;
      if (sVar14 != 0) {
        pcVar16 = ls->buff->buffer;
        do {
          if (pcVar16[sVar14 - 1] == cVar2) {
            pcVar16[sVar14 - 1] = cVar3;
          }
          sVar14 = sVar14 - 1;
        } while (sVar14 != 0);
      }
      iVar11 = luaO_str2d(ls->buff->buffer,ls->buff->n - 1,&seminfo->r);
      if (iVar11 != 0) {
        return 0x11f;
      }
      buffreplace(ls,ls->decpoint,'.');
      lexerror(ls,"malformed number",0x11f);
    case 0x3a:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 != 0x3a) {
        return 0x3a;
      }
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      return 0x11d;
    case 0x3c:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 != 0x3d) {
        return 0x3c;
      }
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      return 0x11b;
    case 0x3d:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 != 0x3d) {
        return 0x3d;
      }
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      return 0x119;
    case 0x3e:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 != 0x3d) {
        return 0x3e;
      }
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      return 0x11a;
    default:
      if (uVar9 == 0xffffffff) {
        return 0x11e;
      }
      goto switchD_0010b3b5_caseD_e;
    }
  }
  if (uVar9 != 0x5b) {
    if (uVar9 == 0x7e) {
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      if (uVar9 != 0x3d) {
        return 0x7e;
      }
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
      return 0x11c;
    }
switchD_0010b3b5_caseD_e:
    if ((""[(long)(int)uVar9 + 1] & 1) == 0) {
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar8 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar8 = (uint)*pbVar5;
      }
      ls->current = uVar8;
      return uVar9;
    }
    do {
      save(ls,ls->current);
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar9 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar9 = (uint)*pbVar5;
      }
      ls->current = uVar9;
    } while ((""[(long)(int)uVar9 + 1] & 3) != 0);
    pTVar12 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
    seminfo->ts = pTVar12;
    if ((pTVar12->tsv).tt != '\x04') {
      return 0x120;
    }
    if ((pTVar12->tsv).extra == 0) {
      return 0x120;
    }
    return (pTVar12->tsv).extra | 0x100;
  }
  iVar11 = skip_sep(ls);
  if (-1 < iVar11) {
    read_long_string(ls,seminfo,iVar11);
    return 0x121;
  }
  if (iVar11 == -1) {
    return 0x5b;
  }
  pcVar16 = "invalid long string delimiter";
LAB_0010bd2f:
  lexerror(ls,pcVar16,0x121);
joined_r0x0010b618:
  local_38 = pSVar7;
  if (uVar8 == uVar9) {
    local_38 = pSVar6;
    save(ls,uVar8);
    pZVar4 = ls->z;
    sVar14 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar14 == 0) {
      uVar9 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar9 = (uint)*pbVar5;
    }
    ls->current = uVar9;
    pTVar12 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    seminfo->ts = pTVar12;
    return 0x121;
  }
  if ((int)uVar8 < 0x5c) {
    if (uVar8 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x11e);
    }
    if ((uVar8 == 10) || (uVar8 == 0xd)) {
      pcVar16 = "unfinished string";
      goto LAB_0010bd2f;
    }
LAB_0010b683:
    save(ls,uVar8);
    pZVar4 = ls->z;
    sVar14 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar14 == 0) {
      uVar8 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar8 = (uint)*pbVar5;
    }
    ls->current = uVar8;
  }
  else {
    if (uVar8 != 0x5c) goto LAB_0010b683;
    pZVar4 = ls->z;
    sVar14 = pZVar4->n;
    pZVar4->n = pZVar4->n - 1;
    if (sVar14 == 0) {
      uVar8 = luaZ_fill(pZVar4);
    }
    else {
      pbVar5 = (byte *)pZVar4->p;
      pZVar4->p = (char *)(pbVar5 + 1);
      uVar8 = (uint)*pbVar5;
    }
    ls->current = uVar8;
    if ((int)uVar8 < 0x62) {
      if ((int)uVar8 < 0x22) {
        if (uVar8 == 0xffffffff) goto LAB_0010b8ad;
        if ((uVar8 != 10) && (uVar8 != 0xd)) goto switchD_0010b6ee_caseD_6f;
        inclinenumber(ls);
        uVar17 = 10;
      }
      else {
        uVar17 = uVar8;
        if ((int)uVar8 < 0x5c) {
          if ((uVar8 == 0x22) || (uVar8 == 0x27)) goto LAB_0010b880;
        }
        else if ((uVar8 == 0x5c) || (uVar17 = 7, uVar8 == 0x61)) goto LAB_0010b880;
switchD_0010b6ee_caseD_6f:
        if ((""[(long)(int)uVar8 + 1] & 2) == 0) {
          escerror(ls,&ls->current,1,"invalid escape sequence");
        }
        lVar18 = 0;
        uVar17 = 0;
        do {
          uVar8 = ls->current;
          if ((""[(long)(int)uVar8 + 1] & 2) == 0) goto LAB_0010b7b8;
          local_44[lVar18] = uVar8;
          pZVar4 = ls->z;
          sVar14 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar14 == 0) {
            uVar10 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar10 = (uint)*pbVar5;
          }
          uVar17 = (uVar8 + uVar17 * 10) - 0x30;
          ls->current = uVar10;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        lVar18 = 3;
LAB_0010b7b8:
        iVar11 = (int)lVar18;
        seminfo = local_38;
        if (0xff < (int)uVar17) {
          pcVar16 = "decimal escape too large";
LAB_0010bd46:
          escerror(ls,(int *)local_44,iVar11,pcVar16);
        }
      }
    }
    else {
      switch(uVar8) {
      case 0x6e:
        uVar17 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
      case 0x79:
        goto switchD_0010b6ee_caseD_6f;
      case 0x72:
        uVar17 = 0xd;
        break;
      case 0x74:
        uVar17 = 9;
        break;
      case 0x76:
        uVar17 = 0xb;
        break;
      case 0x78:
        local_44[0] = 0x78;
        uVar17 = 0;
        lVar18 = 1;
        do {
          pZVar4 = ls->z;
          sVar14 = pZVar4->n;
          pZVar4->n = pZVar4->n - 1;
          if (sVar14 == 0) {
            uVar8 = luaZ_fill(pZVar4);
          }
          else {
            pbVar5 = (byte *)pZVar4->p;
            pZVar4->p = (char *)(pbVar5 + 1);
            uVar8 = (uint)*pbVar5;
          }
          ls->current = uVar8;
          local_44[lVar18] = uVar8;
          if ((""[(long)(int)uVar8 + 1] & 0x10) == 0) {
            iVar11 = (int)lVar18 + 1;
            pcVar16 = "hexadecimal digit expected";
            goto LAB_0010bd46;
          }
          iVar11 = luaO_hexavalue(uVar8);
          uVar17 = iVar11 + uVar17 * 0x10;
          lVar18 = lVar18 + 1;
          seminfo = local_38;
        } while (lVar18 != 3);
        break;
      case 0x7a:
        pZVar4 = ls->z;
        sVar14 = pZVar4->n;
        pZVar4->n = pZVar4->n - 1;
        if (sVar14 == 0) {
          uVar8 = luaZ_fill(pZVar4);
          uVar13 = (ulong)uVar8;
        }
        else {
          pbVar5 = (byte *)pZVar4->p;
          pZVar4->p = (char *)(pbVar5 + 1);
          uVar13 = (ulong)*pbVar5;
        }
        ls->current = (int)uVar13;
        bVar1 = ""[(long)(int)uVar13 + 1];
        while ((bVar1 & 8) != 0) {
          if (((int)uVar13 == 0xd) || ((int)uVar13 == 10)) {
            inclinenumber(ls);
          }
          else {
            pZVar4 = ls->z;
            sVar14 = pZVar4->n;
            pZVar4->n = pZVar4->n - 1;
            if (sVar14 == 0) {
              uVar8 = luaZ_fill(pZVar4);
            }
            else {
              pbVar5 = (byte *)pZVar4->p;
              pZVar4->p = (char *)(pbVar5 + 1);
              uVar8 = (uint)*pbVar5;
            }
            ls->current = uVar8;
          }
          uVar13 = (ulong)ls->current;
          bVar1 = ""[uVar13 + 1];
        }
        goto LAB_0010b8ad;
      default:
        if (uVar8 == 0x66) {
          uVar17 = 0xc;
        }
        else {
          if (uVar8 != 0x62) goto switchD_0010b6ee_caseD_6f;
          uVar17 = 8;
        }
      }
LAB_0010b880:
      pZVar4 = ls->z;
      sVar14 = pZVar4->n;
      pZVar4->n = pZVar4->n - 1;
      if (sVar14 == 0) {
        uVar8 = luaZ_fill(pZVar4);
      }
      else {
        pbVar5 = (byte *)pZVar4->p;
        pZVar4->p = (char *)(pbVar5 + 1);
        uVar8 = (uint)*pbVar5;
      }
      ls->current = uVar8;
    }
    save(ls,uVar17);
  }
LAB_0010b8ad:
  uVar8 = ls->current;
  pSVar7 = local_38;
  pSVar6 = local_38;
  goto joined_r0x0010b618;
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          int sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* `skip_sep' may dirty the buffer */
          if (sep >= 0) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        int sep = skip_sep(ls);
        if (sep >= 0) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == -1) return '[';
        else lexerror(ls, "invalid long string delimiter", TK_STRING);
      }
      case '=': {
        next(ls);
        if (ls->current != '=') return '=';
        else { next(ls); return TK_EQ; }
      }
      case '<': {
        next(ls);
        if (ls->current != '=') return '<';
        else { next(ls); return TK_LE; }
      }
      case '>': {
        next(ls);
        if (ls->current != '=') return '>';
        else { next(ls); return TK_GE; }
      }
      case '~': {
        next(ls);
        if (ls->current != '=') return '~';
        else { next(ls); return TK_NE; }
      }
      case ':': {
        next(ls);
        if (ls->current != ':') return ':';
        else { next(ls); return TK_DBCOLON; }
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next(ls, ".")) {
          if (check_next(ls, "."))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        /* else go through */
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        read_numeral(ls, seminfo);
        return TK_NUMBER;
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->tsv.extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}